

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_bnd.c
# Opt level: O1

int main(void)

{
  double dVar1;
  uint uVar2;
  N_Vector uu;
  N_Vector up;
  N_Vector p_Var3;
  long lVar4;
  N_Vector id;
  UserData data;
  long lVar5;
  char *pcVar6;
  int iVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  sunrealtype atol;
  void *mem;
  SUNContext ctx;
  sunrealtype tret;
  long ncfn;
  long netf;
  void *local_78;
  undefined8 local_70;
  N_Vector local_68;
  long local_60;
  N_Vector local_58;
  double local_50;
  sunrealtype local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_78 = (void *)0x0;
  uVar2 = SUNContext_Create(0,&local_70);
  if ((int)uVar2 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    uu = (N_Vector)N_VNew_Serial(100,local_70);
    if (uu == (N_Vector)0x0) {
      main_cold_9();
      return 1;
    }
    up = (N_Vector)N_VClone(uu);
    if (up == (N_Vector)0x0) {
      main_cold_8();
      return 1;
    }
    p_Var3 = (N_Vector)N_VClone(uu);
    if (p_Var3 == (N_Vector)0x0) {
      main_cold_7();
      return 1;
    }
    lVar4 = N_VClone(uu);
    if (lVar4 == 0) {
      main_cold_6();
      return 1;
    }
    id = (N_Vector)N_VClone(uu);
    if (id == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    data = (UserData)malloc(0x18);
    if (data == (UserData)0x0) {
      main_cold_4();
      return 1;
    }
    data->mm = 10;
    data->dx = 0.1111111111111111;
    data->coeff = 81.0;
    SetInitialProfile(data,uu,up,id,p_Var3);
    N_VConst(0,lVar4);
    local_78 = (void *)IDACreate(local_70);
    if (local_78 == (void *)0x0) {
      main_cold_3();
      return 1;
    }
    uVar2 = IDASetUserData(local_78,data);
    if ((int)uVar2 < 0) {
      pcVar6 = "IDASetUserData";
    }
    else {
      uVar2 = IDASetId(local_78,id);
      if ((int)uVar2 < 0) {
        pcVar6 = "IDASetId";
      }
      else {
        uVar2 = IDASetConstraints(local_78,lVar4);
        if ((int)uVar2 < 0) {
          pcVar6 = "IDASetConstraints";
        }
        else {
          N_VDestroy(lVar4);
          uVar2 = IDAInit(0,local_78,heatres,uu,up);
          if ((int)uVar2 < 0) {
            pcVar6 = "IDAInit";
          }
          else {
            atol = 0.001;
            uVar2 = IDASStolerances(0,local_78);
            if ((int)uVar2 < 0) {
              pcVar6 = "IDASStolerances";
            }
            else {
              local_58 = id;
              lVar4 = SUNBandMatrix(100,10,10,local_70);
              if (lVar4 == 0) {
                main_cold_2();
                return 1;
              }
              lVar5 = SUNLinSol_Band(uu,lVar4,local_70);
              if (lVar5 == 0) {
                main_cold_1();
                return 1;
              }
              uVar2 = IDASetLinearSolver(local_78,lVar5,lVar4);
              if ((int)uVar2 < 0) {
                pcVar6 = "IDASetLinearSolver";
              }
              else {
                local_60 = lVar5;
                uVar2 = IDACalcIC(0x47ae147b,local_78,1);
                if ((int)uVar2 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDACalcIC",
                          (ulong)uVar2);
                  return 1;
                }
                local_68 = p_Var3;
                PrintHeader((sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),atol);
                PrintOutput(local_78,0.0,uu);
                iVar7 = 0xb;
                dVar1 = 0.01;
                while (local_50 = dVar1, uVar2 = IDASolve(local_78,&local_48,uu,up,1),
                      -1 < (int)uVar2) {
                  PrintOutput(local_78,local_48,uu);
                  dVar1 = local_50 + local_50;
                  iVar7 = iVar7 + -1;
                  if (iVar7 == 0) {
                    uVar2 = IDAGetNumErrTestFails(local_78,&local_38);
                    if ((int)uVar2 < 0) {
                      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                              "IDAGetNumErrTestFails",(ulong)uVar2);
                    }
                    uVar2 = IDAGetNumNonlinSolvConvFails(local_78,&local_40);
                    p_Var3 = local_68;
                    if ((int)uVar2 < 0) {
                      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                              "IDAGetNumNonlinSolvConvFails",(ulong)uVar2);
                    }
                    printf("\n netf = %ld,   ncfn = %ld \n",local_38,local_40);
                    IDAFree(&local_78);
                    SUNLinSolFree(local_60);
                    SUNMatDestroy(lVar4);
                    N_VDestroy(uu);
                    N_VDestroy(up);
                    N_VDestroy(local_58);
                    N_VDestroy(p_Var3);
                    free(data);
                    SUNContext_Free(&local_70);
                    return 0;
                  }
                }
                pcVar6 = "IDASolve";
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, id, res;
  int retval, iout;
  long int netf, ncfn;
  sunindextype mu, ml;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem  = NULL;
  data = NULL;
  uu = up = constraints = id = res = NULL;
  A                                = NULL;
  LS                               = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Create vectors uu, up, res, constraints, id. */
  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }
  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }
  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }
  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }
  id = N_VClone(uu);
  if (check_retval((void*)id, "N_VNew_Serial", 0)) { return (1); }

  /* Create and load problem data block. */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / ((data->dx) * (data->dx));

  /* Initialize uu, up, id. */
  SetInitialProfile(data, uu, up, id, res);

  /* Set constraints to all 1's for nonnegative solution values. */
  N_VConst(ONE, constraints);

  /* Set remaining input parameters. */
  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Set which components are algebraic or differential */
  retval = IDASetId(mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, heatres, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for use in linear solves */
  mu = MGRID;
  ml = MGRID;
  A  = SUNBandMatrix(NEQ, mu, ml, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver object */
  LS = SUNLinSol_Band(uu, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Call IDACalcIC to correct the initial values. */

  retval = IDACalcIC(mem, IDA_YA_YDP_INIT, t1);
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  /* Print output heading. */
  PrintHeader(rtol, atol);

  PrintOutput(mem, t0, uu);

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters and free memory. */
  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  printf("\n netf = %ld,   ncfn = %ld \n", netf, ncfn);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(id);
  N_VDestroy(res);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}